

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmloutput.cpp
# Opt level: O3

void __thiscall XmlOutput::addDeclaration(XmlOutput *this,QString *version,QString *encoding)

{
  int *piVar1;
  char16_t *pcVar2;
  longlong lVar3;
  long in_FS_OFFSET;
  QByteArrayView QVar4;
  QAnyStringView QVar5;
  QAnyStringView QVar6;
  undefined1 local_c8 [24];
  undefined1 local_b0 [24];
  QArrayData *local_98 [4];
  QString local_78;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 uStack_48;
  undefined4 uStack_44;
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->currentState - Tag < 2) {
    local_58 = 2;
    uStack_54 = 0;
    uStack_50 = 0;
    uStack_4c = 0;
    uStack_48 = 0;
    uStack_44 = 0;
    local_40 = "default";
    QList<QString>::end(&(this->tagStack).super_QList<QString>);
    QString::toLatin1_helper((QString *)&local_78);
    pcVar2 = local_78.d.ptr;
    if (local_78.d.ptr == (char16_t *)0x0) {
      pcVar2 = (char16_t *)&QByteArray::_empty;
    }
    QMessageLogger::debug
              ((char *)&local_58,"<%s>: Cannot add declaration when not in bare state",pcVar2);
    if (&(local_78.d.d)->super_QArrayData == (QArrayData *)0x0) goto LAB_00265630;
    LOCK();
    ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i != 0)
    goto LAB_00265630;
    lVar3 = 1;
  }
  else {
    local_78.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_78.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_78.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QVar4.m_data = (storage_type *)0x22;
    QVar4.m_size = (qsizetype)&local_58;
    QString::fromUtf8(QVar4);
    local_98[0] = (QArrayData *)CONCAT44(uStack_54,local_58);
    doConversion((QString *)local_b0,this,version);
    QVar5.m_size = (size_t)local_98;
    QVar5.field_0.m_data = &local_58;
    QString::arg_impl(QVar5,local_b0._8_4_,(QChar)local_b0._16_2_);
    doConversion((QString *)local_c8,this,encoding);
    QVar6.m_size = (size_t)&local_58;
    QVar6.field_0.m_data = &local_78;
    QString::arg_impl(QVar6,local_c8._8_4_,(QChar)local_c8._16_2_);
    if ((QArrayData *)local_c8._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_c8._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_c8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_c8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_c8._0_8_,2,0x10);
      }
    }
    piVar1 = (int *)CONCAT44(uStack_54,local_58);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT44(uStack_54,local_58),2,0x10);
      }
    }
    if ((QArrayData *)local_b0._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_b0._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_b0._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_b0._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_b0._0_8_,2,0x10);
      }
    }
    if (local_98[0] != (QArrayData *)0x0) {
      LOCK();
      (local_98[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_98[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_98[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_98[0],2,0x10);
      }
    }
    addRaw(this,&local_78);
    if (&(local_78.d.d)->super_QArrayData == (QArrayData *)0x0) goto LAB_00265630;
    LOCK();
    ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i != 0)
    goto LAB_00265630;
    lVar3 = 2;
  }
  QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,lVar3,0x10);
LAB_00265630:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void XmlOutput::addDeclaration(const QString &version, const QString &encoding)
{
    switch(currentState) {
        case Bare:
            break;
        case Tag:
        case Attribute:
            //warn_msg(WarnLogic, "<%s>: Cannot add declaration when not in bare state", tagStack.last().toLatin1().constData());
            qDebug("<%s>: Cannot add declaration when not in bare state", tagStack.last().toLatin1().constData());
            return;
    }
    QString outData = QString("<?xml version=\"%1\" encoding=\"%2\"?>")
                              .arg(doConversion(version))
                              .arg(doConversion(encoding));
    addRaw(outData);
}